

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::btToLevel(Engine *this,int level)

{
  int iVar1;
  ostream *poVar2;
  uint in_ESI;
  long in_RDI;
  vec<int> *in_stack_00000158;
  int in_stack_ffffffffffffff9c;
  Engine *in_stack_ffffffffffffffa0;
  string local_30 [36];
  uint local_c;
  
  local_c = in_ESI;
  if (so.debug) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Engine::btToLevel( ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
    std::operator<<(poVar2,")\n");
  }
  iVar1 = decisionLevel((Engine *)0x280dff);
  if ((iVar1 != 0) || (local_c != 0)) {
    vec<int>::operator[]((vec<int> *)(in_RDI + 0xe8),local_c);
    btToPos(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    vec<int>::resize((vec<int> *)(in_RDI + 0xe8),local_c);
    if ((so.debug & 1U) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"trail_lim is now: ");
      showVec_abi_cxx11_(in_stack_00000158);
      poVar2 = std::operator<<(poVar2,local_30);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string(local_30);
    }
    vec<DecInfo>::resize((vec<DecInfo> *)(in_RDI + 200),local_c);
  }
  return;
}

Assistant:

void Engine::btToLevel(int level) {
	if (so.debug) {
		std::cerr << "Engine::btToLevel( " << level << ")\n";
	}
	if (decisionLevel() == 0 && level == 0) {
		return;
	}
	assert(decisionLevel() > level);

	btToPos(trail_lim[level]);
	trail_lim.resize(level);
	if (so.debug) {
		std::cerr << "trail_lim is now: " << showVec(trail_lim) << "\n";
	}
	dec_info.resize(level);
#ifdef HAS_VAR_IMPACT
	last_int = nullptr;
#endif
}